

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

void __thiscall Chip8::CPU::dump(CPU *this)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  int iVar5;
  long lVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------- CPU Registers --------",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  lVar6 = 0;
  do {
    lVar2 = std::cout;
    *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar2 + -0x18);
    if (*(char *)(lVar1 + 0x107201) == '\0') {
      std::ios::widen((char)lVar1 + ' ');
      *(undefined1 *)(lVar1 + 0x107201) = 1;
      lVar2 = std::cout;
    }
    *(undefined1 *)(lVar1 + 0x107200) = 0x30;
    *(undefined8 *)(SDL_SetRenderDrawColor + *(long *)(lVar2 + -0x18)) = 1;
    iVar5 = (int)lVar6;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": 0x",4);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_registers[lVar6]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5 + 4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": 0x",4);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_registers[lVar6 + 4]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5 + 8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": 0x",4);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_registers[lVar6 + 8]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5 + 0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": 0x",4);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_registers[lVar6 + 0xc]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pc: 0x",6);
  *(undefined8 *)(SDL_SetRenderDrawColor + *(long *)(std::cout + -0x18)) = 3;
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,(uint)this->_program_counter);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ix: 0x",6);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
  plVar4 = (long *)std::ostream::operator<<(poVar3,(uint)this->_index_register);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"sp: 0x",6);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
  plVar4 = (long *)std::ostream::operator<<(poVar3,(uint)this->_stack_pointer);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"dt: 0x",6);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  plVar4 = (long *)std::ostream::operator<<(poVar3,(uint)this->_delay_timer);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"st: 0x",6);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  plVar4 = (long *)std::ostream::operator<<(poVar3,(uint)this->_sound_timer);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------------------",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  return;
}

Assistant:

void CPU::dump() {
        std::cout << "-------- CPU Registers --------" << std::endl;
        for (int i=0; i<4; i++) {
            std::cout << std::hex << std::setfill('0') <<
                std::setw(1) << i + 0  << ": 0x" << std::setw(2) << int(_registers[i+0])  << " " <<
                std::setw(1) << i + 4  << ": 0x" << std::setw(2) << int(_registers[i+4])  << " " <<
                std::setw(1) << i + 8  << ": 0x" << std::setw(2) << int(_registers[i+8])  << " " <<
                std::setw(1) << i + 12 << ": 0x" << std::setw(2) << int(_registers[i+12]) << " " <<
                std::endl;
        }
        std::cout << std::endl;

        std::cout << "pc: 0x" << std::setw(3) << int(_program_counter) << std::endl
                  << "ix: 0x" << std::setw(3) << int(_index_register) << std::endl
                  << "sp: 0x" << std::setw(3) << int(_stack_pointer) << std::endl
                  << "dt: 0x" << std::setw(2) << int(_delay_timer) << std::endl
                  << "st: 0x" << std::setw(2) << int(_sound_timer) << std::endl;

        std::cout << "-------------------------------" << std::endl;
        std::cout << std::endl;
    }